

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint uVar1;
  unsigned_long *puVar2;
  timestamp_t tVar3;
  timestamp_t *ptVar4;
  timestamp_t *ptVar5;
  idx_t iVar6;
  timestamp_t *ptVar7;
  int64_t *piVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  interval_t iVar14;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  interval_t interval;
  interval_t interval_00;
  int64_t *local_78;
  timestamp_t *extraout_RDX;
  timestamp_t *extraout_RDX_00;
  timestamp_t *extraout_RDX_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &rdata->micros;
      iVar9 = 0;
      iVar6 = count;
      ptVar7 = result_data;
      do {
        uVar1 = ldata[iVar9].days;
        iVar14.micros = (int64_t)ptVar7;
        iVar14._0_8_ = *local_78;
        iVar14 = Interval::Invert(*(Interval **)(local_78 + -1),iVar14);
        right_01._0_8_ = iVar14.micros;
        right_01.micros = iVar6;
        tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)uVar1,(date_t)iVar14.months,right_01);
        result_data[iVar9].value = tVar3.value;
        iVar9 = iVar9 + 1;
        local_78 = local_78 + 2;
        ptVar7 = extraout_RDX_01;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    ptVar4 = (timestamp_t *)0x0;
    ptVar7 = result_data;
    uVar10 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar13 = puVar2[(long)ptVar4];
      }
      uVar12 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar12 = count;
      }
      uVar11 = uVar12;
      if (uVar13 != 0) {
        uVar11 = uVar10;
        if (uVar13 == 0xffffffffffffffff) {
          if (uVar10 < uVar12) {
            piVar8 = &rdata[uVar10].micros;
            ptVar5 = ptVar4;
            do {
              uVar1 = ldata[uVar11].days;
              interval.micros = (int64_t)ptVar7;
              interval._0_8_ = *piVar8;
              iVar14 = Interval::Invert(*(Interval **)(piVar8 + -1),interval);
              right._0_8_ = iVar14.micros;
              right.micros = (int64_t)ptVar5;
              tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)uVar1,(date_t)iVar14.months,right);
              result_data[uVar11].value = tVar3.value;
              uVar11 = uVar11 + 1;
              piVar8 = piVar8 + 2;
              ptVar7 = extraout_RDX;
            } while (uVar12 != uVar11);
          }
        }
        else if (uVar10 < uVar12) {
          piVar8 = &rdata[uVar10].micros;
          uVar11 = 0;
          ptVar5 = ptVar4;
          do {
            if ((uVar13 >> (uVar11 & 0x3f) & 1) != 0) {
              uVar1 = ldata[uVar10 + uVar11].days;
              interval_00.micros = (int64_t)ptVar7;
              interval_00._0_8_ = *piVar8;
              iVar14 = Interval::Invert(*(Interval **)(piVar8 + -1),interval_00);
              right_00._0_8_ = iVar14.micros;
              right_00.micros = (int64_t)ptVar5;
              tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)uVar1,(date_t)iVar14.months,right_00);
              (result_data + uVar10)[uVar11].value = tVar3.value;
              ptVar5 = result_data + uVar10;
              ptVar7 = extraout_RDX_00;
            }
            uVar11 = uVar11 + 1;
            piVar8 = piVar8 + 2;
          } while ((uVar10 - uVar12) + uVar11 != 0);
          uVar11 = uVar10 + uVar11;
        }
      }
      ptVar4 = (timestamp_t *)((long)&ptVar4->value + 1);
      uVar10 = uVar11;
    } while (ptVar4 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}